

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O1

uint __thiscall CVmHashFuncCI::compute_hash(CVmHashFuncCI *this,char *s,size_t l)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  uint __c;
  
  if (l == 0) {
    uVar3 = 0;
  }
  else {
    sVar4 = 0;
    uVar3 = 0;
    do {
      cVar1 = s[sVar4];
      __c = (uint)cVar1;
      if (((-1 < cVar1) && (iVar2 = islower(__c), -1 < cVar1)) && (iVar2 != 0)) {
        __c = toupper(__c);
      }
      uVar3 = uVar3 + (__c & 0xff);
      sVar4 = sVar4 + 1;
    } while (l != sVar4);
  }
  return uVar3;
}

Assistant:

unsigned int CVmHashFuncCI::compute_hash(const char *s, size_t l) const
{
    uint acc;

    /*
     *   Add up all the character values in the string, converting all
     *   characters to upper-case.
     */
    for (acc = 0 ; l != 0 ; ++s, --l)
    {
        uchar c;

        c = (uchar)(is_lower(*s) ? to_upper(*s) : *s);
        acc += c;
    }

    /* return the accumulated value */
    return acc;
}